

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmem.cpp
# Opt level: O0

void asmjit::vMemMgrReset(VMemMgr *self,bool keepVirtualMemory)

{
  byte in_SIL;
  long in_RDI;
  MemNode *next;
  MemNode *node;
  void *p;
  undefined8 local_40;
  
  local_40 = *(void **)(in_RDI + 0x58);
  while (local_40 != (void *)0x0) {
    p = *(void **)((long)local_40 + 0x28);
    if ((in_SIL & 1) == 0) {
      OSUtils::releaseVirtualMemory(p,0x126d45);
    }
    free(*(void **)((long)local_40 + 0x58));
    free(local_40);
    local_40 = p;
  }
  *(undefined8 *)(in_RDI + 0x40) = 0;
  *(undefined8 *)(in_RDI + 0x48) = 0;
  *(undefined8 *)(in_RDI + 0x50) = 0;
  *(undefined8 *)(in_RDI + 0x58) = 0;
  *(undefined8 *)(in_RDI + 0x60) = 0;
  *(undefined8 *)(in_RDI + 0x68) = 0;
  return;
}

Assistant:

static void vMemMgrReset(VMemMgr* self, bool keepVirtualMemory) noexcept {
  MemNode* node = self->_first;

  while (node) {
    MemNode* next = node->next;

    if (!keepVirtualMemory)
      vMemMgrReleaseVMem(self, node->mem, node->size);

    Internal::releaseMemory(node->baUsed);
    Internal::releaseMemory(node);

    node = next;
  }

  self->_allocatedBytes = 0;
  self->_usedBytes = 0;

  self->_root = nullptr;
  self->_first = nullptr;
  self->_last = nullptr;
  self->_optimal = nullptr;
}